

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaHeat2D_kry.c
# Opt level: O1

void PrintHeader(sunrealtype rtol,sunrealtype atol)

{
  puts("\nidaHeat2D_kry: Heat equation, serial example problem for IDA ");
  puts("         Discretized heat equation on 2D unit square. ");
  printf("         Zero boundary conditions,");
  puts(" polynomial initial conditions.");
  printf("         Mesh dimensions: %d x %d",10,10);
  printf("        Total system size: %d\n\n",100);
  printf("Tolerance parameters:  rtol = %g   atol = %g\n",0,0x3f50624dd2f1a9fc);
  puts("Constraints set to force all solution components >= 0. ");
  puts("Linear solver: SPGMR, preconditioner using diagonal elements. ");
  return;
}

Assistant:

static void PrintHeader(sunrealtype rtol, sunrealtype atol)
{
  printf("\nidaHeat2D_kry: Heat equation, serial example problem for IDA \n");
  printf("         Discretized heat equation on 2D unit square. \n");
  printf("         Zero boundary conditions,");
  printf(" polynomial initial conditions.\n");
  printf("         Mesh dimensions: %d x %d", MGRID, MGRID);
  printf("        Total system size: %d\n\n", NEQ);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("Tolerance parameters:  rtol = %Lg   atol = %Lg\n", rtol, atol);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("Tolerance parameters:  rtol = %g   atol = %g\n", rtol, atol);
#else
  printf("Tolerance parameters:  rtol = %g   atol = %g\n", rtol, atol);
#endif
  printf("Constraints set to force all solution components >= 0. \n");
  printf("Linear solver: SPGMR, preconditioner using diagonal elements. \n");
}